

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void exprSetHeight(Expr *p)

{
  int iVar1;
  Select *p_00;
  long lVar2;
  long lVar3;
  int local_c;
  
  local_c = 0;
  if ((p->pLeft != (Expr *)0x0) && (iVar1 = p->pLeft->nHeight, 0 < iVar1)) {
    local_c = iVar1;
  }
  if ((p->pRight != (Expr *)0x0) && (iVar1 = p->pRight->nHeight, local_c < iVar1)) {
    local_c = iVar1;
  }
  p_00 = (Select *)(p->x).pList;
  if ((p->flags & 0x800) == 0) {
    if ((p_00 != (Select *)0x0) && (0 < (long)*(int *)&p_00->pEList)) {
      lVar3 = 0;
      do {
        lVar2 = *(long *)(*(long *)&p_00->op + lVar3);
        if ((lVar2 != 0) && (iVar1 = *(int *)(lVar2 + 0x28), local_c < iVar1)) {
          local_c = iVar1;
        }
        lVar3 = lVar3 + 0x20;
      } while ((long)*(int *)&p_00->pEList * 0x20 != lVar3);
    }
  }
  else {
    heightOfSelect(p_00,&local_c);
  }
  p->nHeight = local_c + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = 0;
  heightOfExpr(p->pLeft, &nHeight);
  heightOfExpr(p->pRight, &nHeight);
  if( ExprHasProperty(p, EP_xIsSelect) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else{
    heightOfExprList(p->x.pList, &nHeight);
  }
  p->nHeight = nHeight + 1;
}